

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DImporter.cpp
# Opt level: O0

void __thiscall
Assimp::X3DImporter::GeometryHelper_Extend_PolylineIdxToLineIdx
          (X3DImporter *this,list<int,_std::allocator<int>_> *pPolylineCoordIdx,
          list<int,_std::allocator<int>_> *pLineCoordIdx)

{
  const_iterator cVar1;
  bool bVar2;
  reference piVar3;
  bool local_62;
  bool local_61;
  _Self local_58;
  value_type_conflict3 local_4c;
  _List_const_iterator<int> local_48;
  const_iterator plit_next;
  _List_const_iterator<int> local_38;
  _Self local_30;
  _Self local_28;
  const_iterator plit;
  list<int,_std::allocator<int>_> *pLineCoordIdx_local;
  list<int,_std::allocator<int>_> *pPolylineCoordIdx_local;
  X3DImporter *this_local;
  
  plit._M_node = (_List_node_base *)pLineCoordIdx;
  local_28._M_node =
       (_List_node_base *)std::__cxx11::list<int,_std::allocator<int>_>::begin(pPolylineCoordIdx);
  do {
    local_30._M_node =
         (_List_node_base *)std::__cxx11::list<int,_std::allocator<int>_>::end(pPolylineCoordIdx);
    bVar2 = std::operator!=(&local_28,&local_30);
    cVar1 = plit;
    if (!bVar2) {
      return;
    }
    local_38._M_node = (_List_node_base *)std::_List_const_iterator<int>::operator++(&local_28,0);
    piVar3 = std::_List_const_iterator<int>::operator*(&local_38);
    std::__cxx11::list<int,_std::allocator<int>_>::push_back
              ((list<int,_std::allocator<int>_> *)cVar1._M_node,piVar3);
    while( true ) {
      piVar3 = std::_List_const_iterator<int>::operator*(&local_28);
      local_61 = false;
      if (*piVar3 != -1) {
        plit_next = std::__cxx11::list<int,_std::allocator<int>_>::end(pPolylineCoordIdx);
        local_61 = std::operator!=(&local_28,&plit_next);
      }
      if (local_61 == false) break;
      std::_List_const_iterator<int>::_List_const_iterator(&local_48);
      local_48._M_node = local_28._M_node;
      std::_List_const_iterator<int>::operator++(&local_48);
      cVar1 = plit;
      piVar3 = std::_List_const_iterator<int>::operator*(&local_28);
      std::__cxx11::list<int,_std::allocator<int>_>::push_back
                ((list<int,_std::allocator<int>_> *)cVar1._M_node,piVar3);
      local_4c = -1;
      std::__cxx11::list<int,_std::allocator<int>_>::push_back
                ((list<int,_std::allocator<int>_> *)plit._M_node,&local_4c);
      piVar3 = std::_List_const_iterator<int>::operator*(&local_48);
      local_62 = true;
      if (*piVar3 != -1) {
        local_58._M_node =
             (_List_node_base *)
             std::__cxx11::list<int,_std::allocator<int>_>::end(pPolylineCoordIdx);
        local_62 = std::operator==(&local_48,&local_58);
      }
      cVar1._M_node = plit._M_node;
      if (local_62 != false) break;
      piVar3 = std::_List_const_iterator<int>::operator*(&local_28);
      std::__cxx11::list<int,_std::allocator<int>_>::push_back
                ((list<int,_std::allocator<int>_> *)cVar1._M_node,piVar3);
      local_28._M_node = local_48._M_node;
    }
  } while( true );
}

Assistant:

void X3DImporter::GeometryHelper_Extend_PolylineIdxToLineIdx(const std::list<int32_t>& pPolylineCoordIdx, std::list<int32_t>& pLineCoordIdx)
{
    std::list<int32_t>::const_iterator plit = pPolylineCoordIdx.begin();

	while(plit != pPolylineCoordIdx.end())
	{
		// add first point of polyline
		pLineCoordIdx.push_back(*plit++);
		while((*plit != (-1)) && (plit != pPolylineCoordIdx.end()))
		{
			std::list<int32_t>::const_iterator plit_next;

			plit_next = plit, ++plit_next;
			pLineCoordIdx.push_back(*plit);// second point of previous line.
			pLineCoordIdx.push_back(-1);// delimiter
			if((*plit_next == (-1)) || (plit_next == pPolylineCoordIdx.end())) break;// current polyline is finished

			pLineCoordIdx.push_back(*plit);// first point of next line.
			plit = plit_next;
		}// while((*plit != (-1)) && (plit != pPolylineCoordIdx.end()))
	}// while(plit != pPolylineCoordIdx.end())
}